

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifcvs(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  runsdef *prVar2;
  size_t sVar3;
  uint uVar4;
  int len;
  runcxdef *prVar6;
  char *pcVar7;
  char buf [30];
  char acStack_38 [40];
  int iVar5;
  
  pcVar7 = acStack_38;
  prVar6 = ctx->bifcxrun;
  uVar4 = (uint)prVar6->runcxsp[-1].runstyp;
  if (7 < uVar4 - 1) {
switchD_0020cd55_caseD_2:
    prVar6->runcxerr->errcxptr->erraav[0].errastr = "cvtstr";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x3ff);
  }
  prVar2 = prVar6->runcxsp + -1;
  switch(uVar4) {
  case 1:
    prVar6->runcxsp = prVar2;
    if (prVar2->runstyp != '\x01') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    sprintf(acStack_38,"%ld",(ctx->bifcxrun->runcxsp->runsv).runsvnum);
    sVar3 = strlen(acStack_38);
    len = (int)sVar3;
    prVar6 = ctx->bifcxrun;
    goto LAB_0020cdd2;
  default:
    goto switchD_0020cd55_caseD_2;
  case 3:
    goto switchD_0020cd55_caseD_3;
  case 5:
    prVar6->runcxsp = prVar2;
    uVar1 = prVar2->runstyp;
    prVar6 = ctx->bifcxrun;
    iVar5 = 3;
    len = 3;
    pcVar7 = "pushnil";
    break;
  case 8:
    prVar6->runcxsp = prVar2;
    uVar1 = prVar2->runstyp;
    prVar6 = ctx->bifcxrun;
    iVar5 = 4;
    len = 4;
    pcVar7 = "pushtrue";
  }
  pcVar7 = pcVar7 + 4;
  if ((uVar1 != '\b') && (len = iVar5, prVar6->runcxsp->runstyp != '\x05')) {
    prVar6->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ed);
  }
LAB_0020cdd2:
  runpstr(prVar6,pcVar7,len,0);
switchD_0020cd55_caseD_3:
  return;
}

Assistant:

void bifcvs(bifcxdef *ctx, int argc)
{
    char *p;
    int   len;
    char  buf[30];
    
    bifcntargs(ctx, 1, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_NIL:
        p = "nil";
        len = 3;
        (void)runpoplog(ctx->bifcxrun);
        break;
        
    case DAT_TRUE:
        p = "true";
        len = 4;
        (void)runpoplog(ctx->bifcxrun);
        break;
        
    case DAT_NUMBER:
        sprintf(buf, "%ld", runpopnum(ctx->bifcxrun));
        p = buf;
        len = strlen(buf);
        break;

    case DAT_SSTRING:
        /* leave the string value on the stack unchanged */
        return;

    default:
        /* throw the RUNEXITOBJ error */
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "cvtstr");
    }
    
    runpstr(ctx->bifcxrun, p, len, 0);
}